

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
::HashTable(HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
            *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong *puVar5;
  TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  *pTVar6;
  ulong uVar7;
  TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  *local_f0;
  TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  local_d0;
  int local_14;
  HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  *pHStack_10;
  int i;
  HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  *this_local;
  
  this->capacity = 8;
  this->size = 0;
  this->PRIME = 7;
  uVar1 = this->capacity;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar4 = SUB168(auVar2 * ZEXT816(0xb8),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0xb8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  pHStack_10 = this;
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar1;
  pTVar6 = (TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
            *)(puVar5 + 1);
  if (uVar1 != 0) {
    local_f0 = pTVar6;
    do {
      TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
      ::TableItems(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != pTVar6 + uVar1);
  }
  this->table = pTVar6;
  iVar3 = lablnet::findLeastPrime((int)this->capacity);
  this->PRIME = iVar3;
  for (local_14 = 0; (long)local_14 < this->capacity; local_14 = local_14 + 1) {
    memset(&local_d0,0,0xb8);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::TableItems(&local_d0);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::operator=(this->table + local_14,&local_d0);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::~TableItems(&local_d0);
  }
  return;
}

Assistant:

HashTable() {
        this->table = new TableItems<K, V>[capacity];
        this->PRIME = lablnet::findLeastPrime(this->capacity);
        for (int i = 0; i< this->capacity; i++) {
            this->table[i] = TableItems<K, V>();
        }
    }